

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

Vec_Ptr_t * Cec_ManPatCollectPatterns(Cec_ManPat_t *pMan,int nInputs,int nWordsInit)

{
  char cVar1;
  uint uVar2;
  Vec_Int_t *p;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  byte bVar8;
  void **ppvVar9;
  uint uVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  long lVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  Vec_Str_t *pVVar15;
  size_t __size;
  void **ppvVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Vec_Ptr_t *vPres;
  timespec ts;
  uint local_88;
  timespec local_78;
  uint local_64;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  int local_50;
  uint local_4c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  p = pMan->vPattern1;
  iVar6 = pMan->iStart;
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  lVar22 = (long)nWordsInit;
  lVar12 = (long)nInputs;
  __size = (lVar22 * 4 + 8) * lVar12;
  local_50 = iVar6;
  ppvVar7 = (void **)malloc(__size);
  uVar20 = (ulong)(uint)nInputs;
  if (0 < nInputs) {
    ppvVar16 = ppvVar7 + lVar12;
    ppvVar9 = ppvVar7;
    uVar14 = uVar20;
    do {
      *ppvVar9 = ppvVar16;
      ppvVar9 = ppvVar9 + 1;
      ppvVar16 = (void **)((long)ppvVar16 + lVar22 * 4);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  local_58 = (Vec_Ptr_t *)malloc(0x10);
  local_58->nSize = nInputs;
  local_58->nCap = nInputs;
  local_58->pArray = ppvVar7;
  Gia_ManRandomInfo(local_58,0,0,nWordsInit);
  ppvVar7 = (void **)malloc(__size);
  if (0 < nInputs) {
    ppvVar16 = ppvVar7 + lVar12;
    ppvVar9 = ppvVar7;
    do {
      *ppvVar9 = ppvVar16;
      ppvVar9 = ppvVar9 + 1;
      ppvVar16 = (void **)((long)ppvVar16 + lVar22 * 4);
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  local_60 = (Vec_Ptr_t *)malloc(0x10);
  local_60->nSize = nInputs;
  local_60->nCap = nInputs;
  local_60->pArray = ppvVar7;
  if (0 < nInputs) {
    lVar22 = 0;
    do {
      memset(ppvVar7[lVar22],0,(long)(nWordsInit * 4));
      lVar22 = lVar22 + 1;
    } while (lVar12 != lVar22);
  }
  local_64 = nWordsInit << 5;
  uVar10 = pMan->iStart;
  pVVar15 = pMan->vStorage;
  uVar11 = pVVar15->nSize;
  pVVar13 = local_58;
  if ((int)uVar10 < (int)uVar11) {
    local_88 = 0xffffffff;
    uVar20 = 0;
    local_40 = CONCAT44(in_register_00000014,nWordsInit);
    uVar4 = local_64;
    do {
      p->nSize = 0;
      iVar6 = uVar10 + 1;
      pMan->iStart = iVar6;
      if ((int)uVar10 < 0) {
LAB_008fa466:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      uVar18 = uVar11;
      if ((int)uVar11 < (int)uVar10) {
        uVar18 = uVar10;
      }
      bVar8 = 0;
      uVar17 = 0;
      while( true ) {
        if (uVar18 == uVar10) goto LAB_008fa466;
        pcVar3 = pVVar15->pArray;
        cVar1 = pcVar3[uVar10];
        if (-1 < cVar1) break;
        uVar17 = uVar17 | ((int)cVar1 & 0x7fU) << (bVar8 & 0x1f);
        iVar5 = uVar10 + 2;
        uVar10 = uVar10 + 1;
        bVar8 = bVar8 + 7;
        pMan->iStart = iVar5;
        if (iVar6 < 0) goto LAB_008fa466;
      }
      uVar10 = pMan->iStart;
      iVar6 = uVar10 + 1;
      pMan->iStart = iVar6;
      local_38 = uVar20;
      if ((int)uVar10 < 0) goto LAB_008fa466;
      uVar17 = (int)cVar1 << (bVar8 & 0x1f) | uVar17;
      if ((int)uVar11 < (int)uVar10) {
        uVar11 = uVar10;
      }
      bVar8 = 0;
      uVar18 = 0;
      while( true ) {
        if (uVar11 == uVar10) goto LAB_008fa466;
        cVar1 = pcVar3[uVar10];
        if (-1 < cVar1) break;
        uVar18 = uVar18 | ((int)cVar1 & 0x7fU) << (bVar8 & 0x1f);
        iVar5 = uVar10 + 2;
        uVar10 = uVar10 + 1;
        bVar8 = bVar8 + 7;
        pMan->iStart = iVar5;
        if (iVar6 < 0) goto LAB_008fa466;
      }
      uVar18 = (int)cVar1 << (bVar8 & 0x1f) | uVar18;
      Vec_IntPush(p,uVar18);
      if (1 < (int)uVar17) {
        uVar10 = 1;
        do {
          uVar11 = pMan->iStart;
          iVar6 = uVar11 + 1;
          pMan->iStart = iVar6;
          if ((int)uVar11 < 0) goto LAB_008fa466;
          uVar2 = pMan->vStorage->nSize;
          if ((int)uVar2 < (int)uVar11) {
            uVar2 = uVar11;
          }
          bVar8 = 0;
          uVar19 = 0;
          while( true ) {
            if (uVar2 == uVar11) goto LAB_008fa466;
            cVar1 = pMan->vStorage->pArray[uVar11];
            if (-1 < cVar1) break;
            uVar19 = uVar19 | ((int)cVar1 & 0x7fU) << (bVar8 & 0x1f);
            iVar5 = uVar11 + 2;
            uVar11 = uVar11 + 1;
            bVar8 = bVar8 + 7;
            pMan->iStart = iVar5;
            if (iVar6 < 0) goto LAB_008fa466;
          }
          uVar18 = uVar18 + ((int)cVar1 << (bVar8 & 0x1f) | uVar19);
          Vec_IntPush(p,uVar18);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar17);
      }
      vPres = local_60;
      uVar10 = local_64;
      if (p->nSize != uVar17) {
        __assert_fail("Vec_IntSize(vPat) == Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x7d,"void Cec_ManPatRestore(Cec_ManPat_t *, Vec_Int_t *)");
      }
      uVar11 = 1;
      if (1 < (int)uVar4) {
        uVar11 = 1;
        do {
          iVar6 = Cec_ManPatCollectTry(pVVar13,vPres,uVar11,p->pArray,p->nSize);
          if (iVar6 != 0) break;
          uVar11 = uVar11 + 1 + (uint)((int)(uVar11 + 1) % (int)uVar10 == 0);
        } while ((int)uVar11 < (int)uVar4);
      }
      if ((int)local_88 <= (int)uVar11) {
        local_88 = uVar11;
      }
      if (uVar11 == uVar4 - 1) {
        Vec_PtrReallocSimInfo(pVVar13);
        iVar5 = (int)local_40;
        local_4c = iVar5 * 2;
        Gia_ManRandomInfo(pVVar13,0,iVar5,local_4c);
        Vec_PtrReallocSimInfo(vPres);
        iVar6 = vPres->nSize;
        if (0 < (long)iVar6) {
          ppvVar7 = local_60->pArray;
          lVar12 = 0;
          do {
            memset((void *)((long)ppvVar7[lVar12] + (long)(iVar5 << 2)),0,(long)(iVar5 << 2));
            lVar12 = lVar12 + 1;
          } while (iVar6 != lVar12);
        }
        uVar4 = uVar4 * 2;
        local_40 = (ulong)local_4c;
        pVVar13 = local_58;
        vPres = local_60;
      }
      uVar10 = pMan->iStart;
      pVVar15 = pMan->vStorage;
      uVar11 = pVVar15->nSize;
      uVar20 = local_38;
    } while ((int)uVar10 < (int)uVar11);
  }
  else {
    local_88 = 0xffffffff;
    uVar20 = 0;
    vPres = local_60;
  }
  if (vPres->pArray != (void **)0x0) {
    free(vPres->pArray);
    vPres->pArray = (void **)0x0;
  }
  free(vPres);
  lVar12 = local_48;
  if (pVVar13->nSize < 2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar14 = (ulong)((long)pVVar13->pArray[1] - (long)*pVVar13->pArray) >> 2;
  pMan->nSeries =
       (int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
            (long)nWordsInit);
  iVar6 = clock_gettime(3,&local_78);
  lVar21 = -1;
  lVar22 = -1;
  if (-1 < iVar6) {
    lVar22 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  pMan->timePack = pMan->timePack + (lVar22 - lVar12);
  iVar5 = 3;
  iVar6 = clock_gettime(3,&local_78);
  if (-1 < iVar6) {
    lVar21 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  pMan->timeTotal = pMan->timeTotal + (lVar21 - lVar12);
  pMan->iStart = local_50;
  if (pMan->fVerbose != 0) {
    Abc_Print(iVar5,"Total = %5d. Max used = %5d. Full = %5d. Series = %d. ",uVar20 & 0xffffffff,
              (ulong)local_88,(ulong)local_64,(ulong)(uint)pMan->nSeries);
    Abc_Print(iVar5,"%s =","Time");
    iVar5 = 3;
    iVar6 = clock_gettime(3,&local_78);
    if (iVar6 < 0) {
      lVar22 = -1;
    }
    else {
      lVar22 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar22 - lVar12) / 1000000.0);
    Cec_ManPatPrintStats(pMan);
  }
  return pVVar13;
}

Assistant:

Vec_Ptr_t * Cec_ManPatCollectPatterns( Cec_ManPat_t *  pMan, int nInputs, int nWordsInit )
{
    Vec_Int_t * vPat = pMan->vPattern1;
    Vec_Ptr_t * vInfo, * vPres;
    int k, kMax = -1, nPatterns = 0;
    int iStartOld = pMan->iStart;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
    abctime clk = Abc_Clock();
    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Gia_ManRandomInfo( vInfo, 0, 0, nWords );
    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( pMan->iStart < Vec_StrSize(pMan->vStorage) )
    {
        nPatterns++;
        Cec_ManPatRestore( pMan, vPat );
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Gia_ManRandomInfo( vInfo, 0, nWords, 2*nWords );
            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
    Vec_PtrFree( vPres );
    pMan->nSeries = Vec_PtrReadWordsSimInfo(vInfo) / nWordsInit;
    pMan->timePack += Abc_Clock() - clk;
    pMan->timeTotal += Abc_Clock() - clk;
    pMan->iStart = iStartOld;
    if ( pMan->fVerbose )
    {
        Abc_Print( 1, "Total = %5d. Max used = %5d. Full = %5d. Series = %d. ", 
            nPatterns, kMax, nWordsInit*32, pMan->nSeries );
        ABC_PRT( "Time", Abc_Clock() - clk );
        Cec_ManPatPrintStats( pMan );
    }
    return vInfo;
}